

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writing_persistence_to_file.h
# Opt level: O0

ostream * Gudhi::operator<<(ostream *out,Persistence_interval_common<double,_int> *it)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  Persistence_interval_common<double,_int> *it_local;
  ostream *out_local;
  
  iVar1 = it->arith_element_;
  iVar3 = std::numeric_limits<int>::max();
  if (iVar1 != iVar3) {
    poVar5 = (ostream *)std::ostream::operator<<(out,it->arith_element_);
    std::operator<<(poVar5,"  ");
  }
  uVar2 = it->dimension_;
  uVar4 = std::numeric_limits<unsigned_int>::max();
  if (uVar2 != uVar4) {
    poVar5 = (ostream *)std::ostream::operator<<(out,it->dimension_);
    std::operator<<(poVar5," ");
  }
  poVar5 = (ostream *)std::ostream::operator<<(out,it->birth_);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,it->death_);
  std::operator<<(poVar5," ");
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Persistence_interval_common& it) {
    if (it.arith_element_ != std::numeric_limits<Coefficient_field>::max()) {
      out << it.arith_element_ << "  ";
    }
    if (it.dimension_ != std::numeric_limits<unsigned>::max()) {
      out << it.dimension_ << " ";
    }
    out << it.birth_ << " " << it.death_ << " ";
    return out;
  }